

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O1

void __thiscall phoenix_flm_t::_read(phoenix_flm_t *this)

{
  vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>
  *this_00;
  uint16_t uVar1;
  uint32_t uVar2;
  pointer __p;
  flm_entry_t *this_01;
  pointer *__ptr;
  uint uVar3;
  undefined1 local_48 [32];
  
  kaitai::kstream::read_bytes_abi_cxx11_((string *)local_48,(this->super_kstruct).m__io,10);
  std::__cxx11::string::operator=((string *)&this->m_signature,(string *)local_48);
  if ((flm_entry_t *)local_48._0_8_ != (flm_entry_t *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  uVar1 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_num_entries = uVar1;
  uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_reserved = uVar2;
  __p = (pointer)operator_new(0x18);
  (__p->
  super__Vector_base<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->
  super__Vector_base<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->
  super__Vector_base<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
           *)&this->m_entries,__p);
  uVar3 = (uint)this->m_num_entries;
  if (this->m_num_entries != 0) {
    do {
      this_00 = (vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>
                 *)(this->m_entries)._M_t.
                   super___uniq_ptr_impl<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_*,_false>
                   ._M_head_impl;
      this_01 = (flm_entry_t *)operator_new(0x58);
      flm_entry_t::flm_entry_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
      local_48._0_8_ = this_01;
      std::
      vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>,std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>>
      ::
      emplace_back<std::unique_ptr<phoenix_flm_t::flm_entry_t,std::default_delete<phoenix_flm_t::flm_entry_t>>>
                (this_00,(unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>
                          *)local_48);
      if ((flm_entry_t *)local_48._0_8_ != (flm_entry_t *)0x0) {
        (**(code **)(*(long *)local_48._0_8_ + 8))();
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void phoenix_flm_t::_read() {
    m_signature = m__io->read_bytes(10);
    m_num_entries = m__io->read_u2le();
    m_reserved = m__io->read_u4le();
    m_entries = std::unique_ptr<std::vector<std::unique_ptr<flm_entry_t>>>(new std::vector<std::unique_ptr<flm_entry_t>>());
    const int l_entries = num_entries();
    for (int i = 0; i < l_entries; i++) {
        m_entries->push_back(std::move(std::unique_ptr<flm_entry_t>(new flm_entry_t(m__io, this, m__root))));
    }
}